

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

size_t jessilib::starts_with_length<char16_t,char16_t>
                 (basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix)

{
  char16_t cVar1;
  size_t sVar2;
  char16_t *pcVar3;
  size_t sVar4;
  uint uVar5;
  char16_t *pcVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  
  pcVar6 = in_string._M_str;
  uVar7 = in_string._M_len;
  pcVar3 = in_prefix._M_str;
  sVar4 = in_prefix._M_len;
  if (uVar7 <= sVar4 - 1) {
    return 0;
  }
  sVar8 = 0;
  do {
    cVar1 = *pcVar6;
    uVar10 = (uint)(ushort)cVar1;
    lVar9 = 1;
    if (((uVar7 == 1) || ((cVar1 & 0xfc00U) != 0xd800)) || ((pcVar6[1] & 0xfc00U) != 0xdc00)) {
      lVar11 = 1;
    }
    else {
      uVar10 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pcVar6[1] + 0xfca02400;
      lVar11 = 2;
    }
    cVar1 = *pcVar3;
    uVar5 = (uint)(ushort)cVar1;
    if (((sVar4 != 1) && ((cVar1 & 0xfc00U) == 0xd800)) && ((pcVar3[1] & 0xfc00U) == 0xdc00)) {
      uVar5 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pcVar3[1] + 0xfca02400;
      lVar9 = 2;
    }
    if (uVar10 != uVar5) {
      return 0;
    }
    sVar4 = sVar4 - lVar9;
    sVar8 = sVar8 + lVar11;
    uVar7 = uVar7 - lVar11;
    if (uVar7 == 0) break;
    pcVar6 = pcVar6 + lVar11;
    pcVar3 = pcVar3 + lVar9;
  } while (sVar4 != 0);
  sVar2 = 0;
  if (sVar4 == 0) {
    sVar2 = sVar8;
  }
  return sVar2;
}

Assistant:

size_t starts_with_length(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (string_front.codepoint != prefix_front.codepoint) {
			// Codepoints aren't the same
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}